

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlElement * __thiscall TiXmlNode::NextSiblingElement(TiXmlNode *this,char *_value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  do {
    this = this->next;
    if (this == (TiXmlNode *)0x0) {
      return (TiXmlElement *)0x0;
    }
    iVar1 = strcmp(((this->value).rep_)->str,_value);
  } while (iVar1 != 0);
  do {
    iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[5])(this);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[5])(this);
      return (TiXmlElement *)CONCAT44(extraout_var_00,iVar1);
    }
    do {
      this = this->next;
      if (this == (TiXmlNode *)0x0) {
        return (TiXmlElement *)0x0;
      }
      iVar1 = strcmp(((this->value).rep_)->str,_value);
    } while (iVar1 != 0);
  } while( true );
}

Assistant:

const TiXmlElement* TiXmlNode::NextSiblingElement( const char * _value ) const
{
	const TiXmlNode* node;

	for (	node = NextSibling( _value );
			node;
			node = node->NextSibling( _value ) )
	{
		if ( node->ToElement() )
			return node->ToElement();
	}
	return 0;
}